

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O2

Sampler * vkt::texture::util::createSampler
                    (Sampler *__return_storage_ptr__,WrapMode wrapU,WrapMode wrapV,WrapMode wrapW,
                    FilterMode minFilterMode,FilterMode magFilterMode)

{
  Vector<float,_4> local_48;
  
  tcu::Vector<float,_4>::Vector(&local_48,0.0);
  __return_storage_ptr__->wrapS = wrapU;
  __return_storage_ptr__->wrapT = wrapV;
  __return_storage_ptr__->wrapR = wrapW;
  __return_storage_ptr__->minFilter = minFilterMode;
  __return_storage_ptr__->magFilter = magFilterMode;
  __return_storage_ptr__->lodThreshold = 0.0;
  __return_storage_ptr__->normalizedCoords = true;
  __return_storage_ptr__->compare = COMPAREMODE_NONE;
  __return_storage_ptr__->compareChannel = 0;
  *(undefined8 *)&(__return_storage_ptr__->borderColor).v = local_48.m_data._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->borderColor).v + 8) = local_48.m_data._8_8_;
  __return_storage_ptr__->seamlessCubeMap = false;
  __return_storage_ptr__->depthStencilMode = MODE_DEPTH;
  return __return_storage_ptr__;
}

Assistant:

tcu::Sampler createSampler (tcu::Sampler::WrapMode wrapU, tcu::Sampler::WrapMode wrapV, tcu::Sampler::WrapMode wrapW, tcu::Sampler::FilterMode minFilterMode, tcu::Sampler::FilterMode magFilterMode)
{
	return tcu::Sampler(wrapU, wrapV, wrapW,
						minFilterMode, magFilterMode,
						0.0f /* lod threshold */,
						true /* normalized coords */,
						tcu::Sampler::COMPAREMODE_NONE /* no compare */,
						0 /* compare channel */,
						tcu::Vec4(0.0f) /* border color, not used */);
}